

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  SerialArena *this_00;
  __pointer_type pcVar2;
  CleanupNode *pCVar3;
  char *v2;
  ArenaAlign AVar4;
  CleanupNode *pCVar5;
  Nonnull<const_char_*> pcVar6;
  __pointer_type pAVar7;
  CleanupNode *pCVar8;
  __pointer_type pAVar9;
  void *pvVar10;
  long in_FS_OFFSET;
  
  if (*(uint64_t *)(in_FS_OFFSET + -0x78) != this->tag_and_id_) {
    pvVar10 = AllocateAlignedWithCleanupFallback(this,n,align,destructor);
    return pvVar10;
  }
  this_00 = *(SerialArena **)(in_FS_OFFSET + -0x70);
  AVar4 = ArenaAlignAs(align);
  pcVar2 = (this_00->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    AllocateAlignedWithCleanup();
LAB_001f559e:
    pvVar10 = SerialArena::AllocateAlignedWithCleanupFallback(this_00,n,align,destructor);
    return pvVar10;
  }
  n = n + 7 & 0xfffffffffffffff8;
  pvVar10 = (void *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pAVar1 = (__pointer_type)((long)pvVar10 + n);
  if ((__pointer_type)this_00->limit_ < pAVar1) goto LAB_001f559e;
  (this_00->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar5 = (this_00->cleanup_list_).next_;
  if ((this_00->cleanup_list_).limit_ <= pCVar5) goto LAB_001f55c7;
  (this_00->cleanup_list_).next_ = pCVar5 + 1;
  pCVar5->elem = pvVar10;
  pCVar5->destructor = destructor;
  while ((pCVar5 = (CleanupNode *)(this_00->cleanup_list_).prefetch_ptr_,
         pCVar5 != (CleanupNode *)0x0 && (pCVar5 < (CleanupNode *)(this_00->cleanup_list_).head_)))
  {
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_001f55c7:
    cleanup::ChunkList::AddFallback(&this_00->cleanup_list_,pvVar10,destructor,this_00);
  }
  pCVar3 = (this_00->cleanup_list_).next_;
  if (((long)pCVar5 - (long)pCVar3 < 0x181) &&
     (pCVar8 = (this_00->cleanup_list_).limit_, pCVar5 < pCVar8)) {
    if (pCVar3 < pCVar5) {
      pCVar3 = pCVar5;
    }
    pCVar5 = pCVar3;
    if (pCVar5 != (CleanupNode *)0x0) {
      if (pCVar5 + 0x18 < pCVar8) {
        pCVar8 = pCVar5 + 0x18;
      }
      for (; pCVar5 < pCVar8; pCVar5 = pCVar5 + 4) {
      }
      goto LAB_001f551d;
    }
  }
  else {
LAB_001f551d:
    (this_00->cleanup_list_).prefetch_ptr_ = (char *)pCVar5;
    v2 = (this_00->ptr_)._M_b._M_p;
    if (this_00->limit_ < v2) {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<char_const*,char_const*>
                         (this_00->limit_,v2,"limit_ >= ptr()");
    }
    else {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      pAVar9 = (__pointer_type)this_00->prefetch_ptr_;
      if ((pAVar9 == (__pointer_type)0x0) || ((this_00->head_)._M_b._M_p <= pAVar9)) {
        if ((0x400 < (long)pAVar9 - (long)pAVar1) ||
           (pAVar7 = (__pointer_type)this_00->limit_, pAVar7 <= pAVar9)) {
LAB_001f5567:
          this_00->prefetch_ptr_ = (char *)pAVar9;
          return pvVar10;
        }
        if (pAVar1 < pAVar9) {
          pAVar1 = pAVar9;
        }
        pAVar9 = pAVar1;
        if (pAVar9 != (__pointer_type)0x0) {
          if (pAVar9 + 0x40 < pAVar7) {
            pAVar7 = pAVar9 + 0x40;
          }
          for (; pAVar9 < pAVar7; pAVar9 = pAVar9 + 4) {
          }
          goto LAB_001f5567;
        }
        goto LAB_001f5687;
      }
      AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
    }
    AllocateAlignedWithCleanup();
  }
  AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_001f5687:
  AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (ABSL_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}